

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O1

QAMList * __thiscall
OSTEI_HRR_Algorithm_Base::GenerateAMReq
          (QAMList *__return_storage_ptr__,OSTEI_HRR_Algorithm_Base *this,QAM *am,RRStepType rrstep)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  QAM local_188;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QAM,_std::allocator<QAM>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(rrstep) {
  case I:
    local_158 = *(undefined8 *)(am->qam)._M_elems;
    uStack_150 = 0;
    local_148 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_140 = 0;
    pcVar4 = (am->tag)._M_dataplus._M_p;
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar4,pcVar4 + (am->tag)._M_string_length);
    local_188.qam._M_elems[0] = (int)local_158 + -1;
    local_188.qam._M_elems[1] = local_158._4_4_ + 1;
    paVar1 = &local_188.tag.field_2;
    local_188.qam._M_elems[2] = (int)local_148;
    local_188.qam._M_elems[3] = (int)((ulong)local_148 >> 0x20);
    if (local_50 == &local_40) {
      local_188.tag.field_2._8_8_ = local_40._8_8_;
      local_188.tag._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_188.tag._M_dataplus._M_p = (pointer)local_50;
    }
    local_188.tag._M_string_length = local_48;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_50 = &local_40;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>(__return_storage_ptr__,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.tag._M_dataplus._M_p != paVar1) {
      operator_delete(local_188.tag._M_dataplus._M_p);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[3];
    local_158 = *(undefined8 *)((am->qam)._M_elems + 1);
    uStack_150 = 0;
    paVar6 = &local_60;
    pcVar4 = (am->tag)._M_dataplus._M_p;
    local_70 = paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar4,pcVar4 + (am->tag)._M_string_length);
    local_188.qam._M_elems[0] = iVar2 + -1;
    local_188.qam._M_elems[1] = (int)local_158;
    local_188.qam._M_elems[2] = (int)((ulong)local_158 >> 0x20);
    if (local_70 == paVar6) {
      local_188.tag.field_2._8_8_ = local_60._8_8_;
      local_188.tag._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_188.tag._M_dataplus._M_p = (pointer)local_70;
    }
    local_188.tag._M_string_length = local_68;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_188.qam._M_elems[3] = iVar3;
    local_70 = paVar6;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>(__return_storage_ptr__,&local_188);
    paVar5 = local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.tag._M_dataplus._M_p != paVar1) {
      operator_delete(local_188.tag._M_dataplus._M_p);
      paVar5 = local_70;
    }
    break;
  case J:
    local_158 = *(undefined8 *)(am->qam)._M_elems;
    uStack_150 = 0;
    local_148 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_140 = 0;
    pcVar4 = (am->tag)._M_dataplus._M_p;
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar4,pcVar4 + (am->tag)._M_string_length);
    local_188.qam._M_elems[0] = (int)local_158 + 1;
    local_188.qam._M_elems[1] = local_158._4_4_ + -1;
    paVar1 = &local_188.tag.field_2;
    local_188.qam._M_elems[2] = (int)local_148;
    local_188.qam._M_elems[3] = (int)((ulong)local_148 >> 0x20);
    if (local_90 == &local_80) {
      local_188.tag.field_2._8_8_ = local_80._8_8_;
      local_188.tag._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_188.tag._M_dataplus._M_p = (pointer)local_90;
    }
    local_188.tag._M_string_length = local_88;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_90 = &local_80;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>(__return_storage_ptr__,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.tag._M_dataplus._M_p != paVar1) {
      operator_delete(local_188.tag._M_dataplus._M_p);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    iVar2 = (am->qam)._M_elems[0];
    iVar3 = (am->qam)._M_elems[1];
    local_158 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_150 = 0;
    paVar6 = &local_a0;
    pcVar4 = (am->tag)._M_dataplus._M_p;
    local_b0 = paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar4,pcVar4 + (am->tag)._M_string_length);
    local_188.qam._M_elems[1] = iVar3 + -1;
    local_188.qam._M_elems[2] = (int)local_158;
    local_188.qam._M_elems[3] = (int)((ulong)local_158 >> 0x20);
    if (local_b0 == paVar6) {
      local_188.tag.field_2._8_8_ = local_a0._8_8_;
      local_188.tag._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_188.tag._M_dataplus._M_p = (pointer)local_b0;
    }
    local_188.tag._M_string_length = local_a8;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_188.qam._M_elems[0] = iVar2;
    local_b0 = paVar6;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>(__return_storage_ptr__,&local_188);
    paVar5 = local_b0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.tag._M_dataplus._M_p != paVar1) {
      operator_delete(local_188.tag._M_dataplus._M_p);
      paVar5 = local_b0;
    }
    break;
  case K:
    local_158 = *(undefined8 *)(am->qam)._M_elems;
    uStack_150 = 0;
    local_148 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_140 = 0;
    pcVar4 = (am->tag)._M_dataplus._M_p;
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar4,pcVar4 + (am->tag)._M_string_length);
    local_188.qam._M_elems[2] = (int)local_148 + -1;
    local_188.qam._M_elems[3] = local_148._4_4_ + 1;
    paVar1 = &local_188.tag.field_2;
    local_188.qam._M_elems[0] = (int)local_158;
    local_188.qam._M_elems[1] = (int)((ulong)local_158 >> 0x20);
    if (local_d0 == &local_c0) {
      local_188.tag.field_2._8_8_ = local_c0._8_8_;
      local_188.tag._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_188.tag._M_dataplus._M_p = (pointer)local_d0;
    }
    local_188.tag._M_string_length = local_c8;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_d0 = &local_c0;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>(__return_storage_ptr__,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.tag._M_dataplus._M_p != paVar1) {
      operator_delete(local_188.tag._M_dataplus._M_p);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    local_158 = *(undefined8 *)(am->qam)._M_elems;
    uStack_150 = 0;
    iVar2 = (am->qam)._M_elems[2];
    iVar3 = (am->qam)._M_elems[3];
    paVar6 = &local_e0;
    pcVar4 = (am->tag)._M_dataplus._M_p;
    local_f0 = paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar4,pcVar4 + (am->tag)._M_string_length);
    local_188.qam._M_elems[2] = iVar2 + -1;
    local_188.qam._M_elems[0] = (int)local_158;
    local_188.qam._M_elems[1] = (int)((ulong)local_158 >> 0x20);
    if (local_f0 == paVar6) {
      local_188.tag.field_2._8_8_ = local_e0._8_8_;
      local_188.tag._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_188.tag._M_dataplus._M_p = (pointer)local_f0;
    }
    local_188.tag._M_string_length = local_e8;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_188.qam._M_elems[3] = iVar3;
    local_f0 = paVar6;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>(__return_storage_ptr__,&local_188);
    paVar5 = local_f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.tag._M_dataplus._M_p != paVar1) {
      operator_delete(local_188.tag._M_dataplus._M_p);
      paVar5 = local_f0;
    }
    break;
  case L:
    local_158 = *(undefined8 *)(am->qam)._M_elems;
    uStack_150 = 0;
    local_148 = *(undefined8 *)((am->qam)._M_elems + 2);
    uStack_140 = 0;
    pcVar4 = (am->tag)._M_dataplus._M_p;
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar4,pcVar4 + (am->tag)._M_string_length);
    local_188.qam._M_elems[2] = (int)local_148 + 1;
    local_188.qam._M_elems[3] = local_148._4_4_ + -1;
    paVar1 = &local_188.tag.field_2;
    local_188.qam._M_elems[0] = (int)local_158;
    local_188.qam._M_elems[1] = (int)((ulong)local_158 >> 0x20);
    if (local_110 == &local_100) {
      local_188.tag.field_2._8_8_ = local_100._8_8_;
      local_188.tag._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_188.tag._M_dataplus._M_p = (pointer)local_110;
    }
    local_188.tag._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_110 = &local_100;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>(__return_storage_ptr__,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.tag._M_dataplus._M_p != paVar1) {
      operator_delete(local_188.tag._M_dataplus._M_p);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    local_158 = *(undefined8 *)(am->qam)._M_elems;
    uStack_150 = 0;
    iVar2 = (am->qam)._M_elems[2];
    iVar3 = (am->qam)._M_elems[3];
    paVar6 = &local_120;
    pcVar4 = (am->tag)._M_dataplus._M_p;
    local_130 = paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar4,pcVar4 + (am->tag)._M_string_length);
    local_188.qam._M_elems[3] = iVar3 + -1;
    local_188.qam._M_elems[0] = (int)local_158;
    local_188.qam._M_elems[1] = (int)((ulong)local_158 >> 0x20);
    if (local_130 == paVar6) {
      local_188.tag.field_2._8_8_ = local_120._8_8_;
      local_188.tag._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_188.tag._M_dataplus._M_p = (pointer)local_130;
    }
    local_188.tag._M_string_length = local_128;
    local_128 = 0;
    local_120._M_local_buf[0] = '\0';
    local_188.qam._M_elems[2] = iVar2;
    local_130 = paVar6;
    std::vector<QAM,_std::allocator<QAM>_>::emplace_back<QAM>(__return_storage_ptr__,&local_188);
    paVar5 = local_130;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.tag._M_dataplus._M_p != paVar1) {
      operator_delete(local_188.tag._M_dataplus._M_p);
      paVar5 = local_130;
    }
    break;
  default:
    goto switchD_001149cc_default;
  }
  if (paVar5 != paVar6) {
    operator_delete(paVar5);
  }
switchD_001149cc_default:
  return __return_storage_ptr__;
}

Assistant:

QAMList OSTEI_HRR_Algorithm_Base::GenerateAMReq(QAM am, RRStepType rrstep) const
{
    QAMList req;
    switch(rrstep)
    {
        case RRStepType::I:
            req.push_back({am[0]-1, am[1]+1, am[2]  , am[3]  , am.tag });
            req.push_back({am[0]-1, am[1]  , am[2]  , am[3]  , am.tag });
            break;
        case RRStepType::J:
            req.push_back({am[0]+1, am[1]-1, am[2]  , am[3]  , am.tag });
            req.push_back({am[0]  , am[1]-1, am[2]  , am[3]  , am.tag });
            break;
        case RRStepType::K:
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]+1, am.tag});
            req.push_back({am[0]  , am[1]  , am[2]-1, am[3]  , am.tag});
            break;
        case RRStepType::L:
            req.push_back({am[0]  , am[1]  , am[2]+1, am[3]-1, am.tag});
            req.push_back({am[0]  , am[1]  , am[2]  , am[3]-1, am.tag});
            break;
    }

    return req;
}